

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Souperify.cpp
# Opt level: O1

void __thiscall wasm::DataFlow::Printer::printExpression(Printer *this,Node *node)

{
  uint uVar1;
  Expression *pEVar2;
  pointer ppNVar3;
  ulong uVar4;
  long lVar5;
  char *pcVar6;
  Node *node_00;
  undefined8 uVar7;
  Literal local_38;
  char local_19;
  
  if (node->type != Expr) {
    __assert_fail("node->isExpr()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Souperify.cpp"
                  ,0x219,"void wasm::DataFlow::Printer::printExpression(Node *)");
  }
  pEVar2 = (node->field_1).expr;
  switch(pEVar2->_id) {
  case ConstId:
    Literal::Literal(&local_38,(Literal *)(pEVar2 + 1));
    print(this,&local_38);
    Literal::~Literal(&local_38);
    return;
  case UnaryId:
    uVar1 = *(uint *)(pEVar2 + 1);
    if (5 < uVar1) {
      handle_unreachable("invalid op",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Souperify.cpp"
                         ,0x22d);
    }
    if ((3U >> (uVar1 & 0x1f) & 1) == 0) {
      if ((0xcU >> (uVar1 & 0x1f) & 1) != 0) {
        pcVar6 = "cttz";
        goto LAB_00b4fdc9;
      }
      pcVar6 = "ctpop";
      lVar5 = 5;
    }
    else {
      pcVar6 = "ctlz";
LAB_00b4fdc9:
      lVar5 = 4;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,lVar5);
    local_19 = ' ';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_19,1);
    ppNVar3 = (node->values).
              super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((node->values).
        super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppNVar3) {
      node_00 = *ppNVar3;
      goto LAB_00b4ffdd;
    }
    goto LAB_00b5000d;
  case BinaryId:
    break;
  case SelectId:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"select ",7);
    ppNVar3 = (node->values).
              super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((node->values).
        super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish == ppNVar3) goto LAB_00b5000d;
    printInternal(this,*ppNVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    ppNVar3 = (node->values).
              super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar4 = (long)(node->values).
                  super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppNVar3 >> 3;
    if (1 < uVar4) {
      printInternal(this,ppNVar3[1]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
      ppNVar3 = (node->values).
                super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar4 = (long)(node->values).
                    super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppNVar3 >> 3;
      if (2 < uVar4) {
        printInternal(this,ppNVar3[2]);
        return;
      }
      uVar7 = 2;
      goto LAB_00b5004c;
    }
    goto LAB_00b5001a;
  default:
    handle_unreachable("unexecpted node type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Souperify.cpp"
                       ,0x299);
  }
  switch(*(undefined4 *)(pEVar2 + 1)) {
  case 0:
  case 0x19:
    pcVar6 = "add";
    break;
  case 1:
  case 0x1a:
    pcVar6 = "sub";
    break;
  case 2:
  case 0x1b:
    pcVar6 = "mul";
    break;
  case 3:
  case 0x1c:
    pcVar6 = "sdiv";
    goto LAB_00b4ff75;
  case 4:
  case 0x1d:
    pcVar6 = "udiv";
    goto LAB_00b4ff75;
  case 5:
  case 0x1e:
    pcVar6 = "srem";
    goto LAB_00b4ff75;
  case 6:
  case 0x1f:
    pcVar6 = "urem";
    goto LAB_00b4ff75;
  case 7:
  case 0x20:
    pcVar6 = "and";
    break;
  case 8:
  case 0x21:
    pcVar6 = "or";
    goto LAB_00b4ff0b;
  case 9:
  case 0x22:
    pcVar6 = "xor";
    break;
  case 10:
  case 0x23:
    pcVar6 = "shl";
    break;
  case 0xb:
  case 0x24:
    pcVar6 = "ashr";
    goto LAB_00b4ff75;
  case 0xc:
  case 0x25:
    pcVar6 = "lshr";
    goto LAB_00b4ff75;
  case 0xd:
  case 0x26:
    pcVar6 = "rotl";
    goto LAB_00b4ff75;
  case 0xe:
  case 0x27:
    pcVar6 = "rotr";
LAB_00b4ff75:
    lVar5 = 4;
    goto LAB_00b4ff7a;
  case 0xf:
  case 0x28:
    pcVar6 = "eq";
    goto LAB_00b4ff0b;
  case 0x10:
  case 0x29:
    pcVar6 = "ne";
LAB_00b4ff0b:
    lVar5 = 2;
    goto LAB_00b4ff7a;
  case 0x11:
  case 0x2a:
    pcVar6 = "slt";
    break;
  case 0x12:
  case 0x2b:
    pcVar6 = "ult";
    break;
  case 0x13:
  case 0x2c:
    pcVar6 = "sle";
    break;
  case 0x14:
  case 0x2d:
    pcVar6 = "ule";
    break;
  default:
    handle_unreachable("invalid op",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Souperify.cpp"
                       ,0x289);
  }
  lVar5 = 3;
LAB_00b4ff7a:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,lVar5);
  local_19 = ' ';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_19,1);
  ppNVar3 = (node->values).
            super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((node->values).
      super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish == ppNVar3) {
LAB_00b5000d:
    uVar7 = 0;
    uVar4 = 0;
  }
  else {
    printInternal(this,*ppNVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    ppNVar3 = (node->values).
              super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar4 = (long)(node->values).
                  super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppNVar3 >> 3;
    if (1 < uVar4) {
      node_00 = ppNVar3[1];
LAB_00b4ffdd:
      printInternal(this,node_00);
      return;
    }
LAB_00b5001a:
    uVar7 = 1;
  }
LAB_00b5004c:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar7,uVar4
            );
}

Assistant:

void printExpression(Node* node) {
    assert(node->isExpr());
    // TODO use a Visitor here?
    auto* curr = node->expr;
    if (auto* c = curr->dynCast<Const>()) {
      print(c->value);
    } else if (auto* unary = curr->dynCast<Unary>()) {
      switch (unary->op) {
        case ClzInt32:
        case ClzInt64:
          std::cout << "ctlz";
          break;
        case CtzInt32:
        case CtzInt64:
          std::cout << "cttz";
          break;
        case PopcntInt32:
        case PopcntInt64:
          std::cout << "ctpop";
          break;
        default:
          WASM_UNREACHABLE("invalid op");
      }
      std::cout << ' ';
      auto* value = node->getValue(0);
      printInternal(value);
    } else if (auto* binary = curr->dynCast<Binary>()) {
      switch (binary->op) {
        case AddInt32:
        case AddInt64:
          std::cout << "add";
          break;
        case SubInt32:
        case SubInt64:
          std::cout << "sub";
          break;
        case MulInt32:
        case MulInt64:
          std::cout << "mul";
          break;
        case DivSInt32:
        case DivSInt64:
          std::cout << "sdiv";
          break;
        case DivUInt32:
        case DivUInt64:
          std::cout << "udiv";
          break;
        case RemSInt32:
        case RemSInt64:
          std::cout << "srem";
          break;
        case RemUInt32:
        case RemUInt64:
          std::cout << "urem";
          break;
        case AndInt32:
        case AndInt64:
          std::cout << "and";
          break;
        case OrInt32:
        case OrInt64:
          std::cout << "or";
          break;
        case XorInt32:
        case XorInt64:
          std::cout << "xor";
          break;
        case ShlInt32:
        case ShlInt64:
          std::cout << "shl";
          break;
        case ShrUInt32:
        case ShrUInt64:
          std::cout << "lshr";
          break;
        case ShrSInt32:
        case ShrSInt64:
          std::cout << "ashr";
          break;
        case RotLInt32:
        case RotLInt64:
          std::cout << "rotl";
          break;
        case RotRInt32:
        case RotRInt64:
          std::cout << "rotr";
          break;
        case EqInt32:
        case EqInt64:
          std::cout << "eq";
          break;
        case NeInt32:
        case NeInt64:
          std::cout << "ne";
          break;
        case LtSInt32:
        case LtSInt64:
          std::cout << "slt";
          break;
        case LtUInt32:
        case LtUInt64:
          std::cout << "ult";
          break;
        case LeSInt32:
        case LeSInt64:
          std::cout << "sle";
          break;
        case LeUInt32:
        case LeUInt64:
          std::cout << "ule";
          break;
        default:
          WASM_UNREACHABLE("invalid op");
      }
      std::cout << ' ';
      auto* left = node->getValue(0);
      printInternal(left);
      std::cout << ", ";
      auto* right = node->getValue(1);
      printInternal(right);
    } else if (curr->is<Select>()) {
      std::cout << "select ";
      printInternal(node->getValue(0));
      std::cout << ", ";
      printInternal(node->getValue(1));
      std::cout << ", ";
      printInternal(node->getValue(2));
    } else {
      WASM_UNREACHABLE("unexecpted node type");
    }
  }